

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::ReportScriptCompile_TTD
          (JsrtDebugManager *this,FunctionBody *body,Utf8SourceInfo *utf8SourceInfo,
          CompileScriptException *compileException,bool notify)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  DebugDocument *this_00;
  TrackAllocData local_98;
  DebugDocument *local_70;
  DebugDocument *debugDocument;
  JsrtDebugDocumentManager *debugDocumentManager;
  DynamicObject *local_50;
  DynamicObject *eventDataObject;
  JsrtDebugEventObject debugEventObject;
  ScriptContext *scriptContext;
  bool notify_local;
  CompileScriptException *compileException_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  FunctionBody *body_local;
  JsrtDebugManager *this_local;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    debugEventObject.scriptContext = Js::Utf8SourceInfo::GetScriptContext(utf8SourceInfo);
    JsrtDebugEventObject::JsrtDebugEventObject
              ((JsrtDebugEventObject *)&eventDataObject,debugEventObject.scriptContext);
    local_50 = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&eventDataObject);
    debugDocument = (DebugDocument *)GetDebugDocumentManager(this);
    if (debugDocument == (DebugDocument *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0xc1,"(debugDocumentManager != nullptr)","debugDocumentManager != nullptr"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&Js::DebugDocument::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
               ,0xc4);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_98);
    this_00 = (DebugDocument *)new<Memory::HeapAllocator>(0x20,alloc,true,0x469be0);
    Js::DebugDocument::DebugDocument(this_00,utf8SourceInfo,body);
    local_70 = this_00;
    if (this_00 != (DebugDocument *)0x0) {
      Js::Utf8SourceInfo::SetDebugDocument(utf8SourceInfo,this_00);
    }
    JsrtDebugUtils::AddSourceMetadataToObject(local_50,utf8SourceInfo);
    if (notify) {
      CallDebugEventCallback
                (this,JsDiagDebugEventSourceCompile,local_50,debugEventObject.scriptContext,false);
    }
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&eventDataObject);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportScriptCompile_TTD(Js::FunctionBody* body, Js::Utf8SourceInfo* utf8SourceInfo, CompileScriptException* compileException, bool notify)
{
    if(this->debugEventCallback == nullptr)
    {
        return;
    }

    Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

    JsrtDebugEventObject debugEventObject(scriptContext);
    Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

    JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
    Assert(debugDocumentManager != nullptr);

    // Create DebugDocument and then report JsDiagDebugEventSourceCompile event
    Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, body);
    if(debugDocument != nullptr)
    {
        utf8SourceInfo->SetDebugDocument(debugDocument);
    }

    JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

    if(notify)
    {
        this->CallDebugEventCallback(JsDiagDebugEventSourceCompile, eventDataObject, scriptContext, false /*isBreak*/);
    }
}